

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactWrench.cpp
# Opt level: O0

string * __thiscall
iDynTree::LinkContactWrenches::toString_abi_cxx11_(LinkContactWrenches *this,Model *model)

{
  ostream *poVar1;
  ContactWrench *pCVar2;
  vector<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
  *in_RSI;
  string *in_RDI;
  size_t c;
  size_t nrOfContacts;
  size_t l;
  size_t nrOfLinks;
  stringstream ss;
  LinkIndex in_stack_fffffffffffffd78;
  ostream *in_stack_fffffffffffffd80;
  string local_230 [32];
  string local_210 [32];
  ulong local_1f0;
  string local_1e8 [48];
  size_t local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  stringstream local_1a0 [16];
  ostream local_190 [240];
  LinkIndex in_stack_ffffffffffffff60;
  Model *in_stack_ffffffffffffff68;
  SpatialVector<iDynTree::SpatialForceVector> *in_stack_ffffffffffffff78;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a8 = std::
              vector<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
              ::size(in_RSI);
  for (local_1b0 = 0; local_1b0 < local_1a8; local_1b0 = local_1b0 + 1) {
    local_1b8 = getNrOfContactsForLink
                          ((LinkContactWrenches *)in_stack_fffffffffffffd80,
                           in_stack_fffffffffffffd78);
    if (local_1b8 != 0) {
      poVar1 = std::operator<<(local_190,"Contact wrenches on link ");
      Model::getLinkName_abi_cxx11_(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      poVar1 = std::operator<<(poVar1,local_1e8);
      poVar1 = std::operator<<(poVar1,":");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_1e8);
      for (local_1f0 = 0; local_1f0 < local_1b8; local_1f0 = local_1f0 + 1) {
        poVar1 = std::operator<<(local_190,"Wrench contact with pos: ");
        pCVar2 = contactWrench((LinkContactWrenches *)in_stack_fffffffffffffd80,
                               in_stack_fffffffffffffd78,0x39f165);
        ContactWrench::contactPoint(pCVar2);
        iDynTree::Position::toString_abi_cxx11_();
        poVar1 = std::operator<<(poVar1,local_210);
        poVar1 = std::operator<<(poVar1,",wrench: ");
        pCVar2 = contactWrench((LinkContactWrenches *)in_stack_fffffffffffffd80,
                               in_stack_fffffffffffffd78,0x39f1c4);
        ContactWrench::contactWrench(pCVar2);
        SpatialVector<iDynTree::SpatialForceVector>::toString_abi_cxx11_(in_stack_ffffffffffffff78);
        in_stack_fffffffffffffd80 = std::operator<<(poVar1,local_230);
        std::ostream::operator<<(in_stack_fffffffffffffd80,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_230);
        std::__cxx11::string::~string(local_210);
      }
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string LinkContactWrenches::toString(const Model& model) const
{
    std::stringstream ss;

    size_t nrOfLinks = m_linkContactWrenches.size();
    for(size_t l=0; l < nrOfLinks; l++)
    {
        size_t nrOfContacts = this->getNrOfContactsForLink(l);

        if( nrOfContacts > 0 )
        {
            ss << "Contact wrenches on link " << model.getLinkName(l) << ":" << std::endl;
            for(size_t c=0; c < nrOfContacts; c++ )
            {
                ss << "Wrench contact with pos: " << this->contactWrench(l,c).contactPoint().toString() << ","
                                          "wrench: " << this->contactWrench(l,c).contactWrench().toString() << std::endl;
            }
        }
    }
    return ss.str();
}